

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupSelf(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pGVar10 = Gia_ManAppendObj(p_00);
  uVar17 = *(ulong *)pGVar10;
  *(ulong *)pGVar10 = uVar17 | 0x9fffffff;
  *(ulong *)pGVar10 =
       uVar17 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar10) && (pGVar10 < pGVar3 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar10) && (pGVar10 < pGVar3 + p_00->nObjs)) {
      pVVar11 = p->vCis;
      if (0 < pVVar11->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar11->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001de1a6;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(p_00);
          uVar17 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar17 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar17 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_001de1c5;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_001de1c5;
          pGVar4[iVar6].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
          lVar15 = lVar15 + 1;
          pVVar11 = p->vCis;
        } while (lVar15 < pVVar11->nSize);
      }
      iVar6 = p->nObjs;
      if (0 < iVar6) {
        lVar15 = 8;
        lVar20 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar17 = *(ulong *)((long)pGVar4 + lVar15 + -8);
          if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
            uVar7 = *(uint *)((long)pGVar4 +
                             lVar15 + (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3);
            if (((int)uVar7 < 0) ||
               (uVar14 = *(uint *)((long)pGVar4 +
                                  lVar15 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar14 < 0)) goto LAB_001de203;
            iVar6 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar17 >> 0x1d) & 1,
                                   uVar14 ^ (uint)(uVar17 >> 0x3d) & 1);
            *(int *)(&pGVar4->field_0x0 + lVar15) = iVar6;
            iVar6 = p->nObjs;
          }
          lVar20 = lVar20 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar20 < iVar6);
      }
      iVar16 = p->nRegs;
      pVVar11 = p->vCos;
      uVar7 = pVVar11->nSize;
      if (uVar7 - iVar16 != 0 && iVar16 <= (int)uVar7) {
        uVar17 = 0;
        uVar18 = 0;
        if (0 < (int)uVar7) {
          uVar18 = (ulong)uVar7;
        }
        do {
          if (uVar18 == uVar17) goto LAB_001de1e4;
          iVar1 = pVVar11->pArray[uVar17];
          if (((long)iVar1 < 0) || (iVar6 <= iVar1)) goto LAB_001de1a6;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar1;
          if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
          goto LAB_001de203;
          pGVar4->Value =
               (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
               pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
          uVar17 = uVar17 + 1;
        } while (uVar7 - iVar16 != uVar17);
      }
      if (0 < iVar16) {
        iVar6 = 0;
LAB_001de012:
        pVVar11 = p->vCos;
        uVar7 = pVVar11->nSize;
        uVar14 = iVar6 + (uVar7 - iVar16);
        if (((int)uVar14 < 0) || ((int)uVar7 <= (int)uVar14)) {
LAB_001de1e4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar11->pArray[uVar14];
        if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
          pGVar4 = p->pObjs;
          if (pGVar4 != (Gia_Obj_t *)0x0) {
            pGVar5 = pGVar4 + iVar1;
            uVar14 = (uint)*(undefined8 *)pGVar5;
            if ((int)pGVar5[-(ulong)(uVar14 & 0x1fffffff)].Value < 0) {
LAB_001de203:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            if (((-1 < (int)uVar14) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) ||
               (uVar19 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff,
               (int)uVar19 < (int)(uVar7 - iVar16))) {
              __assert_fail("Gia_ObjIsRi(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar16 = p->vCis->nSize;
            uVar19 = (iVar16 - uVar7) + uVar19;
            if (((int)uVar19 < 0) || (iVar16 <= (int)uVar19)) goto LAB_001de1e4;
            uVar7 = p->vCis->pArray[uVar19];
            if (((long)(int)uVar7 < 0) || ((uint)p->nObjs <= uVar7)) goto LAB_001de1a6;
            uVar7 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) *
                                        0x55555556,
                                   uVar14 >> 0x1d & 1 ^ pGVar5[-(ulong)(uVar14 & 0x1fffffff)].Value,
                                   pGVar4[(int)uVar7].Value);
            pGVar5->Value = uVar7;
            iVar6 = iVar6 + 1;
            iVar16 = p->nRegs;
            if (iVar6 < iVar16) goto LAB_001de012;
            pVVar11 = p->vCos;
            uVar7 = pVVar11->nSize;
          }
          goto LAB_001de12a;
        }
LAB_001de1a6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
LAB_001de12a:
      if (0 < (int)uVar7) {
        lVar15 = 0;
        do {
          iVar6 = pVVar11->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001de1a6;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p_00,p->pObjs[iVar6].Value);
          lVar15 = lVar15 + 1;
          pVVar11 = p->vCos;
        } while (lVar15 < pVVar11->nSize);
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
      pGVar13 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar13;
    }
  }
LAB_001de1c5:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupSelf( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, iCtrl;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    iCtrl = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManHashMux( pNew, iCtrl, Gia_ObjFanin0Copy(pObj), Gia_ObjRiToRo(p, pObj)->Value );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}